

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *Other)

{
  char *pcVar1;
  char *pcVar2;
  pointer pSVar3;
  SHADER_CODE_BASIC_TYPE SVar4;
  Uint8 UVar5;
  Uint8 UVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  Uint32 UVar9;
  
  (this->super_ShaderCodeVariableDesc).pMembers = (Other->super_ShaderCodeVariableDesc).pMembers;
  pcVar1 = (Other->super_ShaderCodeVariableDesc).Name;
  pcVar2 = (Other->super_ShaderCodeVariableDesc).TypeName;
  SVar4 = (Other->super_ShaderCodeVariableDesc).BasicType;
  UVar5 = (Other->super_ShaderCodeVariableDesc).NumRows;
  UVar6 = (Other->super_ShaderCodeVariableDesc).NumColumns;
  UVar7 = (Other->super_ShaderCodeVariableDesc).Offset;
  UVar8 = (Other->super_ShaderCodeVariableDesc).ArraySize;
  UVar9 = (Other->super_ShaderCodeVariableDesc).NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = (Other->super_ShaderCodeVariableDesc).Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar4;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar5;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar6;
  (this->super_ShaderCodeVariableDesc).Offset = UVar7;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar8;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar9;
  (this->super_ShaderCodeVariableDesc).Name = pcVar1;
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar2;
  std::__cxx11::string::string((string *)&this->NameCopy,(string *)&Other->NameCopy);
  std::__cxx11::string::string((string *)&this->TypeNameCopy,(string *)&Other->TypeNameCopy);
  pSVar3 = (Other->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Other->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (Other->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).pMembers =
       &((this->Members).
         super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ShaderCodeVariableDesc;
  return;
}

Assistant:

ShaderCodeVariableDescX(ShaderCodeVariableDescX&& Other) noexcept :
        ShaderCodeVariableDesc{Other},
        // clang-format off
        NameCopy    {std::move(Other.NameCopy)},
        TypeNameCopy{std::move(Other.TypeNameCopy)},
        Members     {std::move(Other.Members)}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();
    }